

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_fwd.hpp
# Opt level: O0

void __thiscall toml::detail::location::location(location *this,source_ptr *src,string *src_name)

{
  shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RDX;
  shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RDI;
  
  std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::shared_ptr
            (in_RDI,in_RDX);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src);
  in_RDI[3].
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  in_RDI[3].
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  in_RDI[4].
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x1;
  return;
}

Assistant:

location(source_ptr src, std::string src_name)
        : source_(std::move(src)), source_name_(std::move(src_name)),
          location_(0), line_number_(1), column_number_(1)
    {}